

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  U32 lastNonNull;
  U32 maxNbBits_00;
  nodeElt *huffNode_00;
  int nonNullRank;
  nodeElt *huffNode;
  nodeElt *huffNode0;
  HUF_buildCTable_wksp_tables *wksp_tables;
  size_t wkspSize_local;
  void *workSpace_local;
  U32 maxNbBits_local;
  U32 maxSymbolValue_local;
  uint *count_local;
  HUF_CElt *tree_local;
  
  huffNode_00 = (nodeElt *)((long)workSpace + 8);
  if (((ulong)workSpace & 3) == 0) {
    if (wkspSize < 0x1100) {
      tree_local = (HUF_CElt *)0xffffffffffffffbe;
    }
    else {
      workSpace_local._0_4_ = maxNbBits;
      if (maxNbBits == 0) {
        workSpace_local._0_4_ = 0xb;
      }
      if (maxSymbolValue < 0x100) {
        memset(workSpace,0,0x1000);
        HUF_sort(huffNode_00,count,maxSymbolValue,(rankPos *)((long)workSpace + 0x1000));
        lastNonNull = HUF_buildTree(huffNode_00,maxSymbolValue);
        maxNbBits_00 = HUF_setMaxHeight(huffNode_00,lastNonNull,(U32)workSpace_local);
        if (maxNbBits_00 < 0xd) {
          HUF_buildCTableFromTree(tree,huffNode_00,lastNonNull,maxSymbolValue,maxNbBits_00);
          tree_local = (HUF_CElt *)(ulong)maxNbBits_00;
        }
        else {
          tree_local = (HUF_CElt *)0xffffffffffffffff;
        }
      }
      else {
        tree_local = (HUF_CElt *)0xffffffffffffffd2;
      }
    }
  }
  else {
    tree_local = (HUF_CElt *)0xffffffffffffffff;
  }
  return (size_t)tree_local;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables = (HUF_buildCTable_wksp_tables*)workSpace;
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
      return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
      return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(tree, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}